

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O2

void __thiscall chrono::copter::Copter<6>::~Copter(Copter<6> *this)

{
  this->_vptr_Copter = (_func_int **)&PTR_GetChassisMeshFilename_abi_cxx11__001a18b0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ::~vector(&this->speeds);
  std::
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ::~vector(&this->motors);
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::~vector(&this->backtorques);
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::~vector(&this->thrusts);
  std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>::
  ~vector(&this->props);
  std::__cxx11::string::~string((string *)&this->propeller_mesh_path);
  std::__cxx11::string::~string((string *)&this->chassis_mesh_path);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~Copter() {}